

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O1

int __thiscall
xercesc_4_0::RegularExpression::matchUnion
          (RegularExpression *this,Context *context,Op *op,XMLSize_t offset)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  bool bVar5;
  Context bestResultContext;
  Context tmpContext;
  uint local_fc;
  Context local_e0;
  Context local_88;
  
  iVar1 = (*op->_vptr_Op[4])(op);
  Context::Context(&local_e0,XMLPlatformUtils::fgMemoryManager);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    local_fc = 0xffffffff;
  }
  else {
    local_fc = 0xffffffff;
    lVar4 = 0;
    do {
      Context::Context(&local_88,context);
      iVar2 = (*op->_vptr_Op[5])(op,lVar4);
      uVar3 = match(this,&local_88,(Op *)CONCAT44(extraout_var_00,iVar2),offset);
      if (((int)uVar3 < 0) || ((int)uVar3 <= (int)local_fc || context->fLimit < (ulong)uVar3)) {
        bVar5 = false;
      }
      else {
        Context::operator=(&local_e0,&local_88);
        bVar5 = context->fLimit == (ulong)uVar3;
        local_fc = uVar3;
      }
      Context::~Context(&local_88);
    } while ((!bVar5) &&
            (bVar5 = CONCAT44(extraout_var,iVar1) + -1 != lVar4, lVar4 = lVar4 + 1, bVar5));
  }
  if (local_fc != 0xffffffff) {
    Context::operator=(context,&local_e0);
  }
  Context::~Context(&local_e0);
  return local_fc;
}

Assistant:

int RegularExpression::matchUnion(Context* const context,
                                   const Op* const op, XMLSize_t offset) const
{
    XMLSize_t opSize = op->getSize();

    Context bestResultContext;
    int bestResult=-1;
    for(XMLSize_t i=0; i < opSize; i++) {
        Context tmpContext(context);
        int ret = match(&tmpContext, op->elementAt(i), offset);
        if (ret >= 0 && (XMLSize_t)ret <= context->fLimit && ret>bestResult)
        {
            bestResult=ret;
            bestResultContext=tmpContext;
            // exit early, if we reached the end of the string
            if((XMLSize_t)ret == context->fLimit)
                break;
        }
    }
    if(bestResult!=-1)
        *context=bestResultContext;
    return bestResult;
}